

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

int nn_chunk_realloc(size_t size,void **chunk)

{
  uint32_t val;
  nn_chunk *self_00;
  size_t sVar1;
  void *__dest;
  void *pvVar2;
  undefined8 *in_RSI;
  ulong in_RDI;
  size_t empty;
  size_t grow;
  void *p;
  int rc;
  size_t hdr_size;
  void *new_ptr;
  nn_chunk *self;
  void **in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_4;
  
  pvVar2 = (void *)*in_RSI;
  self_00 = nn_chunk_getptr(in_stack_ffffffffffffffb0);
  if ((self_00->refcount).n == 1) {
    if (in_RDI <= self_00->size) {
      self_00->size = in_RDI;
      return 0;
    }
    sVar1 = nn_chunk_hdrsize();
    in_stack_ffffffffffffffb0 = (void **)((long)pvVar2 + (-sVar1 - (long)self_00));
    in_stack_ffffffffffffffb8 = (void **)(in_RDI - self_00->size);
    if (sVar1 + in_RDI < in_RDI) {
      return -0xc;
    }
    if (in_stack_ffffffffffffffb8 <= in_stack_ffffffffffffffb0) {
      __dest = (void *)((long)pvVar2 - (long)in_stack_ffffffffffffffb8);
      memmove(__dest,pvVar2,self_00->size);
      self_00->size = in_RDI;
      val = ((int)__dest - (int)self_00) - (int)sVar1;
      nn_putl((uint8_t *)((long)__dest + -4),0xdeadcafe);
      nn_putl((uint8_t *)((long)__dest + -8),val);
      *in_RSI = pvVar2;
      return 0;
    }
  }
  local_4 = nn_chunk_alloc(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           (int)((ulong)pvVar2 >> 0x20),in_stack_ffffffffffffffb8);
  if (local_4 == 0) {
    pvVar2 = nn_chunk_getdata(self_00);
    memcpy((void *)0x0,pvVar2,self_00->size);
    *in_RSI = 0;
    nn_chunk_free(in_stack_ffffffffffffffb0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nn_chunk_realloc (size_t size, void **chunk)
{
    struct nn_chunk *self;
    void *new_ptr;
    size_t hdr_size;
    int rc;
    void *p = *chunk;

    self = nn_chunk_getptr (p);

    /*  Check if we only have one reference to this object, in that case we can
        reallocate the memory chunk. */
    if (self->refcount.n == 1) {

         size_t grow;
         size_t empty;

        /*  If the new size is smaller than the old size, we can just keep
            it.  Avoid an allocation.  We'll have wasted & lost data
            at the end, but who cares.  This is basically "chop". */
        if (size <= self->size) {
            self->size = size;
            return (0);
        }

        hdr_size = nn_chunk_hdrsize ();
        empty = (uint8_t*) p - (uint8_t*) self - hdr_size;
        grow = size - self->size;

        /* Check for overflow. */
        if (hdr_size + size < size) {
            return -ENOMEM;
	}

        /* Can we grow into empty space? */
        if (grow <= empty) {
            new_ptr = (uint8_t *)p - grow;
            memmove (new_ptr, p, self->size);
            self->size = size;

            /*  Recalculate the size of empty space, and reconstruct
                the tag and prefix. */
            empty = (uint8_t *)new_ptr - (uint8_t *)self - hdr_size;
            nn_putl ((uint8_t*) (((uint32_t*) new_ptr) - 1), NN_CHUNK_TAG);
            nn_putl ((uint8_t*) (((uint32_t*) new_ptr) - 2), (uint32_t) empty);
            *chunk = p;
            return (0);
        }
    }

    /*  There are either multiple references to this memory chunk,
        or we cannot reuse the existing space.  We create a new one
        copy the data.  (This is no worse than nn_realloc, btw.) */
    new_ptr = NULL;
    rc = nn_chunk_alloc (size, 0, &new_ptr);

    if (nn_slow (rc != 0)) {
        return rc;
    }

    memcpy (new_ptr, nn_chunk_getdata (self), self->size);
    *chunk = new_ptr;
    nn_chunk_free (p);

    return 0;
}